

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMagicHeader(AsciiParser *this)

{
  bool bVar1;
  ssize_t sVar2;
  ostream *poVar3;
  string local_408;
  allocator local_3e1;
  string local_3e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  ostringstream local_380 [8];
  ostringstream ss_e_1;
  char local_203;
  char local_202;
  char local_201;
  undefined1 local_200 [5];
  char ver [3];
  allocator local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  ostringstream local_198 [8];
  ostringstream ss_e;
  char local_1e;
  char local_1d;
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  AsciiParser *pAStack_18;
  char magic [6];
  AsciiParser *this_local;
  
  pAStack_18 = this;
  bVar1 = SkipWhitespace(this);
  if (bVar1) {
    bVar1 = Eof(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      sVar2 = StreamReader::read(this->_sr,6,(void *)0x6,(size_t)&local_1e);
      if (sVar2 == 0) {
        this_local._7_1_ = false;
      }
      else if (((((local_1e == '#') && (local_1d == 'u')) && (local_1c == 's')) &&
               ((local_1b == 'd' && (local_1a == 'a')))) && (local_19 == ' ')) {
        bVar1 = SkipWhitespace(this);
        if (bVar1) {
          sVar2 = StreamReader::read(this->_sr,3,(void *)0x3,(size_t)&local_203);
          if (sVar2 == 0) {
            this_local._7_1_ = false;
          }
          else if (((local_203 == '1') && (local_202 == '.')) && (local_201 == '0')) {
            this->_version = 1.0;
            SkipUntilNewline(this);
            this_local._7_1_ = true;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_380);
            poVar3 = ::std::operator<<((ostream *)local_380,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseMagicHeader");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x92f);
            ::std::operator<<(poVar3," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_3e0,&local_203,3,&local_3e1);
            ::std::operator+((char *)&local_3c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Version must be `1.0` but got `");
            ::std::operator+(&local_3a0,&local_3c0,"`");
            poVar3 = ::std::operator<<((ostream *)local_380,(string *)&local_3a0);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string((string *)&local_3a0);
            ::std::__cxx11::string::~string((string *)&local_3c0);
            ::std::__cxx11::string::~string(local_3e0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_408);
            ::std::__cxx11::string::~string((string *)&local_408);
            this_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_380);
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_198);
        poVar3 = ::std::operator<<((ostream *)local_198,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ParseMagicHeader");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x91a);
        ::std::operator<<(poVar3," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1d8,&local_1e,6,&local_1d9);
        ::std::operator+((char *)local_1b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Magic header must start with `#usda `(at least single whitespace after \'a\') but got `"
                        );
        poVar3 = ::std::operator<<((ostream *)local_198,local_1b8);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string(local_1b8);
        ::std::__cxx11::string::~string(local_1d8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_200);
        ::std::__cxx11::string::~string((string *)local_200);
        this_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_198);
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ParseMagicHeader() {
  if (!SkipWhitespace()) {
    return false;
  }

  if (Eof()) {
    return false;
  }

  {
    char magic[6];
    if (!_sr->read(6, 6, reinterpret_cast<uint8_t *>(magic))) {
      // eol
      return false;
    }

    if ((magic[0] == '#') && (magic[1] == 'u') && (magic[2] == 's') &&
        (magic[3] == 'd') && (magic[4] == 'a') && (magic[5] == ' ')) {
      // ok
    } else {
      PUSH_ERROR_AND_RETURN(
          "Magic header must start with `#usda `(at least single whitespace "
          "after 'a') but got `" +
          std::string(magic, 6));
    }
  }

  if (!SkipWhitespace()) {
    // eof
    return false;
  }

  // current we only accept "1.0"
  {
    char ver[3];
    if (!_sr->read(3, 3, reinterpret_cast<uint8_t *>(ver))) {
      return false;
    }

    if ((ver[0] == '1') && (ver[1] == '.') && (ver[2] == '0')) {
      // ok
      _version = 1.0f;
    } else {
      PUSH_ERROR_AND_RETURN("Version must be `1.0` but got `" +
                            std::string(ver, 3) + "`");
    }
  }

  SkipUntilNewline();

  return true;
}